

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskBitCount>::
initPrograms(MSCase<vkt::pipeline::multisample::MSCaseSampleMaskBitCount> *this,
            SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ProgramSources *pPVar2;
  ostringstream fs;
  ostringstream vs;
  string local_380;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  long *local_338;
  long local_330;
  long local_328 [2];
  uint local_318 [2];
  value_type local_310 [3];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  MSCaseBaseResolveAndPerSampleFetch::initPrograms
            (&this->super_MSCaseBaseResolveAndPerSampleFetch,programCollection);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(location = 0) in vec4 vs_in_position_ndc;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\tvec4  gl_Position;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\tgl_Position\t= vs_in_position_ndc;\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  local_360._0_8_ = &local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"vertex_shader","");
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_360);
  std::__cxx11::stringbuf::str();
  local_318[0] = 0;
  local_310[0]._M_dataplus._M_p = (pointer)&local_310[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_310,local_380._M_dataplus._M_p,
             local_380._M_dataplus._M_p + local_380._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar2->sources + local_318[0],local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310[0]._M_dataplus._M_p != &local_310[0].field_2) {
    operator_delete(local_310[0]._M_dataplus._M_p,local_310[0].field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ != &local_350) {
    operator_delete((void *)local_360._0_8_,local_350._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"layout(location = 0) out vec4 fs_out_color;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\tuint maskBitCount = 0u;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\tfor (int i = 0; i < 32; ++i)\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\t\tif (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\t\t\t++maskBitCount;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\tif (maskBitCount != 1u)\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\t\tfs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"\t\tfs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"}\n",2);
  local_380._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"fragment_shader","");
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_380);
  std::__cxx11::stringbuf::str();
  local_360._0_4_ = 1;
  local_360._8_8_ = local_350._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_360 + 8),local_338,local_330 + (long)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar2->sources + (local_360._0_8_ & 0xffffffff),(value_type *)(local_360 + 8));
  if ((char *)local_360._8_8_ != local_350._M_local_buf + 8) {
    operator_delete((void *)local_360._8_8_,local_350._8_8_ + 1);
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::ios_base::~ios_base(local_2a8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void MSCase<MSCaseSampleMaskBitCount>::initPrograms (vk::SourceCollections& programCollection) const
{
	MSCaseBaseResolveAndPerSampleFetch::initPrograms(programCollection);

	// Create vertex shader
	std::ostringstream vs;

	vs << "#version 440\n"
		<< "layout(location = 0) in vec4 vs_in_position_ndc;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position	= vs_in_position_ndc;\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	// Create fragment shader
	std::ostringstream fs;

	fs << "#version 440\n"
		<< "\n"
		<< "layout(location = 0) out vec4 fs_out_color;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint maskBitCount = 0u;\n"
		<< "\n"
		<< "	for (int i = 0; i < 32; ++i)\n"
		<< "		if (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n"
		<< "			++maskBitCount;\n"
		<< "\n"
		<< "	if (maskBitCount != 1u)\n"
		<< "		fs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
		<< "	else\n"
		<< "		fs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
		<< "}\n";

	programCollection.glslSources.add("fragment_shader") << glu::FragmentSource(fs.str());
}